

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EAMAdapter.cpp
# Opt level: O0

RealType __thiscall OpenMD::EAMAdapter::getLatticeConstant(EAMAdapter *this)

{
  EAMParameters eamParam;
  EAMAdapter *in_stack_00000088;
  undefined8 local_10;
  
  getEAMParam(in_stack_00000088);
  EAMParameters::~EAMParameters((EAMParameters *)0x29b51e);
  return local_10;
}

Assistant:

RealType EAMAdapter::getLatticeConstant() {
    EAMParameters eamParam = getEAMParam();
    return eamParam.latticeConstant;
  }